

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.h
# Opt level: O0

void __thiscall icu_63::SortKeyByteSink::Append(SortKeyByteSink *this,uint32_t b)

{
  int iVar1;
  uint32_t b_local;
  SortKeyByteSink *this_local;
  
  if (this->ignore_ < 1) {
    if ((this->appended_ < this->capacity_) ||
       (iVar1 = (*(this->super_ByteSink)._vptr_ByteSink[6])(this,1,(ulong)(uint)this->appended_),
       (char)iVar1 != '\0')) {
      this->buffer_[this->appended_] = (char)b;
    }
    this->appended_ = this->appended_ + 1;
    return;
  }
  this->ignore_ = this->ignore_ + -1;
  return;
}

Assistant:

void Append(uint32_t b) {
        if (ignore_ > 0) {
            --ignore_;
        } else {
            if (appended_ < capacity_ || Resize(1, appended_)) {
                buffer_[appended_] = (char)b;
            }
            ++appended_;
        }
    }